

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O0

void sbs_printf(sbstring *sbs,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  int local_3c;
  undefined4 local_38;
  int bytes;
  va_list argp;
  size_t size;
  char *format_local;
  sbstring *sbs_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  argp[0].reg_save_area = sbs->end + -(long)sbs->begin;
  if (argp[0].reg_save_area < (char *)sbs->size) {
    argp[0].overflow_arg_area = local_f8;
    argp[0]._0_8_ = &stack0x00000008;
    bytes = 0x30;
    local_38 = 0x10;
    local_e8 = in_RDX;
    local_e0 = in_RCX;
    local_d8 = in_R8;
    local_d0 = in_R9;
    local_3c = vsnprintf(sbs->end,sbs->size - (long)argp[0].reg_save_area,format,&local_38);
    if (0 < local_3c) {
      if (sbs->size - (long)argp[0].reg_save_area <= (ulong)(long)local_3c) {
        local_3c = ((int)sbs->size - (int)argp[0].reg_save_area) + -1;
        sbs->end[local_3c] = '\0';
      }
      sbs->end = sbs->end + local_3c;
    }
  }
  return;
}

Assistant:

void sbs_printf(struct sbstring *sbs, const char *format, ...)
{
    size_t size = (sbs->end - sbs->begin);

    if (size < sbs->size) {
        va_list argp;
        va_start(argp, format);
        int bytes = vsnprintf(sbs->end, sbs->size - size, format, argp);
        if (bytes > 0) {
            if ((size_t)bytes >= sbs->size - size) {
                bytes = (int)(sbs->size - size - 1);
                /* terminate truncated output */
                sbs->end[bytes] = '\0';
            }
            sbs->end += bytes;
        }
        va_end(argp);
    }
}